

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O2

Name __thiscall
wasm::Names::
getValidNameGivenExisting<std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
          (Names *this,Name root,
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          *existingNames)

{
  Name root_00;
  IString IVar1;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_member_pointer = root.super_IString.str._M_str;
  root_00.super_IString.str._M_len = root.super_IString.str._M_len;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
             ::_M_manager;
  root_00.super_IString.str._M_str = (char *)&local_38;
  IVar1.str = (string_view)
              getValidName(this,root_00,
                           (function<bool_(wasm::Name)> *)
                           std::
                           _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:102:23)>
                           ::_M_manager);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return (IString)(IString)IVar1.str;
}

Assistant:

inline Name getValidNameGivenExisting(Name root, const T& existingNames) {
  return getValidName(root,
                      [&](Name test) { return !existingNames.count(test); });
}